

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fc_layer.h
# Opt level: O0

void __thiscall fc_layer_t::calc_grads(fc_layer_t *this,tensor_t<float> *grad_next_layer)

{
  point_t d;
  reference pvVar1;
  float *pfVar2;
  fc_layer_t *in_RDI;
  float fVar3;
  int m;
  int z;
  int j;
  int i;
  gradient_t *grad;
  int n;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_2c;
  int local_28;
  int local_24;
  int local_14;
  
  tensor_t<float>::clear
            ((tensor_t<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (local_14 = 0; local_14 < (in_RDI->super_layer_t).out.size.x; local_14 = local_14 + 1) {
    pvVar1 = std::vector<gradient_t,_std::allocator<gradient_t>_>::operator[]
                       (&in_RDI->gradients,(long)local_14);
    pfVar2 = tensor_t<float>::operator()
                       ((tensor_t<float> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (int)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
    in_stack_ffffffffffffffa4 = *pfVar2;
    std::vector<float,_std::allocator<float>_>::operator[](&in_RDI->input,(long)local_14);
    fVar3 = activator_derivative
                      ((fc_layer_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
    pvVar1->grad = in_stack_ffffffffffffffa4 * fVar3;
    for (local_24 = 0; local_24 < (in_RDI->super_layer_t).in.size.x; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < (in_RDI->super_layer_t).in.size.y; local_28 = local_28 + 1) {
        for (local_2c = 0; local_2c < (in_RDI->super_layer_t).in.size.z; local_2c = local_2c + 1) {
          d.y = local_28;
          d.x = local_24;
          d.z = local_2c;
          map(in_RDI,d);
          in_stack_ffffffffffffff9c = pvVar1->grad;
          pfVar2 = tensor_t<float>::operator()
                             ((tensor_t<float> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (int)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff9c * *pfVar2;
          pfVar2 = tensor_t<float>::operator()
                             ((tensor_t<float> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              (int)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
          *pfVar2 = in_stack_ffffffffffffffa0 + *pfVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    grads_in.clear();
    for (int n = 0; n < out.size.x; n++) {
      gradient_t &grad = gradients[n];
      grad.grad = grad_next_layer(n, 0, 0) * activator_derivative(input[n]);

      for (int i = 0; i < in.size.x; i++)
        for (int j = 0; j < in.size.y; j++)
          for (int z = 0; z < in.size.z; z++) {
            int m = map({i, j, z});
            grads_in(i, j, z) += grad.grad * weights(m, n, 0);
          }
    }
  }